

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

uint64_t decodeBitsAndAdvance(uint8_t **data)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  pbVar3 = *data;
  *data = pbVar3 + 1;
  uVar2 = (ulong)*pbVar3;
  pbVar3 = pbVar3 + 2;
  for (uVar4 = 0x80; (uVar4 & uVar2) != 0; uVar4 = uVar4 << 7) {
    *data = pbVar3;
    pbVar1 = pbVar3 + -1;
    pbVar3 = pbVar3 + 1;
    uVar2 = (uVar2 - uVar4) * 0x100 | (ulong)*pbVar1;
  }
  return uVar2;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}